

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iris_dataset.cpp
# Opt level: O0

void __thiscall Data::iris_dataset::print_data(iris_dataset *this)

{
  bool bVar1;
  ostream *poVar2;
  reference ppiVar3;
  reference pdVar4;
  double target;
  iterator __end2_1;
  iterator __begin2_1;
  vector<double,_std::allocator<double>_> *__range2_1;
  double value;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  string local_50;
  iris_data *local_30;
  iris_data *iris;
  iterator __end1;
  iterator __begin1;
  vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_> *__range1;
  iris_dataset *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Classname\tValues\tTarget");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>::begin
                     (&this->dataset_rows);
  iris = (iris_data *)
         std::vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>::end
                   (&this->dataset_rows);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<Data::iris_data_**,_std::vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>_>
                      (&__end1,(__normal_iterator<Data::iris_data_**,_std::vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>_>
                                *)&iris);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppiVar3 = __gnu_cxx::
              __normal_iterator<Data::iris_data_**,_std::vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>_>
              ::operator*(&__end1);
    local_30 = *ppiVar3;
    iris_data::get_class_name_abi_cxx11_(&local_50,local_30);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::operator<<(poVar2,"\t");
    std::__cxx11::string::~string((string *)&local_50);
    iris_data::get_values((vector<double,_std::allocator<double>_> *)&__begin2,local_30);
    __end2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&__begin2);
    value = (double)std::vector<double,_std::allocator<double>_>::end
                              ((vector<double,_std::allocator<double>_> *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                        (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&value);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end2);
      printf("%.2f,",*pdVar4);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&__begin2);
    std::operator<<((ostream *)&std::cout,"\t");
    iris_data::get_target((vector<double,_std::allocator<double>_> *)&__begin2_1,local_30);
    __end2_1 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)&__begin2_1);
    target = (double)std::vector<double,_std::allocator<double>_>::end
                               ((vector<double,_std::allocator<double>_> *)&__begin2_1);
    while( true ) {
      bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                        (&__end2_1,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&target);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end2_1);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar4);
      std::operator<<(poVar2,", ");
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2_1);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&__begin2_1);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Data::iris_data_**,_std::vector<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Data::iris_dataset::print_data() {
    std::cout << "Classname\tValues\tTarget" << std::endl;
    for (iris_data *iris : this->dataset_rows) {
        std::cout << iris->get_class_name() << "\t";

        for (double value : iris->get_values())
            printf("%.2f,", value);

        std::cout << "\t";

        for (double target : iris->get_target())
            std::cout << target << ", ";

        std::cout << std::endl;
    }
}